

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O1

char * myStrdupFunc(char *str)

{
  int iVar1;
  size_t sVar2;
  void *__dest;
  char *pcVar3;
  
  if (str != (char *)0x0) {
    sVar2 = strlen(str);
    sVar2 = sVar2 + 1;
    iVar1 = xmlMemUsed();
    if ((long)iVar1 + sVar2 == 0) {
      __dest = (void *)xmlMemMalloc(sVar2);
      if (__dest != (void *)0x0) {
        pcVar3 = (char *)memcpy(__dest,str,sVar2);
        return pcVar3;
      }
    }
    else {
      xmllintMaxmemReached = 1;
    }
  }
  return (char *)0x0;
}

Assistant:

static char *
myStrdupFunc(const char *str) {
    size_t size;
    char *ret;

    if (str == NULL)
        return(NULL);

    size = strlen(str) + 1;
    if (xmlMemUsed() + size > (size_t) xmllintMaxmem) {
#if XMLLINT_ABORT_ON_FAILURE
        abort();
#endif
        xmllintMaxmemReached = 1;
        xmllintOom = 1;
        return(NULL);
    }

    ret = xmlMemMalloc(size);
    if (ret == NULL) {
        xmllintOom = 1;
        return(NULL);
    }

    memcpy(ret, str, size);

    return(ret);
}